

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O0

void qt_qimageScaleAARGBA_up_x_down_y_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  long in_FS_OFFSET;
  anon_class_72_9_523e8b3d scaleSection;
  __m128i v256;
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  multithread_pixels_function<qt_qimageScaleAARGBA_up_x_down_y_sse4<false>(QImageScale::QImageScaleInfo*,unsigned_int*,int,int,int,int)::_lambda(int,int)_1_>
            ((QImageScaleInfo *)0x10000000100,(int)((ulong)local_18 >> 0x20),
             (anon_class_72_9_523e8b3d *)0x10000000100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_qimageScaleAARGBA_up_x_down_y_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                           int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    const int *xpoints = isi->xpoints;
    const int *xapoints = isi->xapoints;
    const int *yapoints = isi->yapoints;

    const __m128i v256 = _mm_set1_epi32(256);

    /* go through every scanline in the output buffer */
    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            const int Cy = yapoints[y] >> 16;
            const int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, yap, Cy, sow, vyap, vCy);

                const int xap = xapoints[x];
                if (xap > 0) {
                    const __m128i vxap = _mm_set1_epi32(xap);
                    const __m128i vinvxap = _mm_sub_epi32(v256, vxap);
                    __m128i vr = qt_qimageScaleAARGBA_helper(sptr + 1, yap, Cy, sow, vyap, vCy);

                    vx = _mm_mullo_epi32(vx, vinvxap);
                    vr = _mm_mullo_epi32(vr, vxap);
                    vx = _mm_add_epi32(vx, vr);
                    vx = _mm_srli_epi32(vx, 8);
                }
                vx = _mm_srli_epi32(vx, 14);
                vx = _mm_packus_epi32(vx, vx);
                vx = _mm_packus_epi16(vx, vx);
                *dptr = _mm_cvtsi128_si32(vx);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}